

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl::commitParameters(Private_Impl *this)

{
  commitSaturation(this);
  commitSharpness(this);
  commitContrast(this);
  mmal_port_parameter_set_rational
            (((this->State).camera_component)->control,0x1002e,
             (MMAL_RATIONAL_T)((ulong)(uint)(this->State).brightness | 0x6400000000));
  commitISO(this);
  if ((this->State).shutterSpeed != 0) {
    commitShutterSpeed(this);
    (this->State).rpc_exposureMode = RASPICAM_EXPOSURE_FIXEDFPS;
  }
  commitExposure(this);
  commitExposureCompensation(this);
  commitMetering(this);
  commitImageEffect(this);
  commitRotation(this);
  commitFlips(this);
  commitVideoStabilization(this);
  commitAWB(this);
  commitAWB_RB(this);
  return;
}

Assistant:

void Private_Impl::commitParameters ( ) {
            assert ( State.camera_component!=0 );
            commitSaturation();
            commitSharpness();
            commitContrast();
            commitBrightness();
            commitISO();
            if ( State.shutterSpeed!=0 ) {
                commitShutterSpeed();
                State.rpc_exposureMode=RASPICAM_EXPOSURE_FIXEDFPS;
                commitExposure();
            } else           commitExposure();
            commitExposureCompensation();
            commitMetering();
            commitImageEffect();
            commitRotation();
            commitFlips();
            commitVideoStabilization();
            commitAWB();
            commitAWB_RB();

        }